

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int aec_decode_get_offsets(aec_stream_conflict *strm,size_t *offsets,size_t offsets_count)

{
  internal_state_conflict *piVar1;
  int iVar2;
  size_t sVar3;
  size_t *__src;
  
  piVar1 = strm->state;
  if (piVar1->offsets == (vector_t *)0x0) {
    iVar2 = -5;
  }
  else {
    sVar3 = vector_size(piVar1->offsets);
    iVar2 = -4;
    if (sVar3 <= offsets_count) {
      __src = vector_data(piVar1->offsets);
      sVar3 = vector_size(piVar1->offsets);
      memcpy(offsets,__src,sVar3 * 8);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int aec_decode_get_offsets(struct aec_stream *strm, size_t *offsets,
                           size_t offsets_count)
{
    struct internal_state *state = strm->state;
    if (state->offsets == NULL) {
        return AEC_RSI_OFFSETS_ERROR;
    }
    if (offsets_count < vector_size(state->offsets)) {
        return AEC_MEM_ERROR;
    }
    memcpy(offsets, vector_data(state->offsets),
           vector_size(state->offsets) * sizeof(size_t));
    return AEC_OK;
}